

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_analyze.hpp
# Opt level: O1

idx_t duckdb::AlpRDFinalAnalyze<float>(AnalyzeState *state)

{
  BlockManager *pBVar1;
  BlockManager *pBVar2;
  BlockManager *pBVar3;
  long lVar4;
  idx_t iVar5;
  idx_t iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  AlpRDAnalyzeState<float> *analyze_state;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pBVar2 = state[1].info.block_manager;
  if (pBVar2 != (BlockManager *)0x0) {
    lVar7 = (long)state[3]._vptr_AnalyzeState - (long)state[2].info.block_manager;
    lVar8 = lVar7 >> 2;
    auVar12._8_4_ = (int)(lVar7 >> 0x22);
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = 0x45300000;
    auVar13._8_4_ = (int)((ulong)pBVar2 >> 0x20);
    auVar13._0_8_ = pBVar2;
    auVar13._12_4_ = 0x45300000;
    dVar10 = alp::AlpRDCompression<float,_true>::FindBestDictionary
                       ((vector<unsigned_int,_true> *)&state[2].info,(State *)(state + 4));
    lVar7 = (long)state[3]._vptr_AnalyzeState - (long)state[2].info.block_manager;
    pBVar3 = (state->info).block_manager;
    lVar4 = lVar7 >> 2;
    auVar15._8_4_ = (int)(lVar7 >> 0x22);
    auVar15._0_8_ = lVar4;
    auVar15._12_4_ = 0x45300000;
    pBVar1 = state[1].info.block_manager;
    auVar16._8_4_ = (int)((ulong)pBVar1 >> 0x20);
    auVar16._0_8_ = pBVar1;
    auVar16._12_4_ = 0x45300000;
    dVar11 = ceil(((auVar16._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)pBVar1) - 4503599627370496.0)) * 0.0009765625);
    dVar11 = (double)((long)dVar11 & 0xffffffff) * 6.0 +
             ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * dVar10 * 0.125 *
             (1.0 / (((auVar12._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                    ((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)pBVar2) - 4503599627370496.0))));
    iVar5 = optional_idx::GetIndex(&pBVar3->block_alloc_size);
    iVar6 = optional_idx::GetIndex(&pBVar3->block_header_size);
    lVar7 = iVar5 - iVar6;
    auVar14._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar14._0_8_ = lVar7;
    auVar14._12_4_ = 0x45300000;
    dVar10 = ceil(dVar11 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) + -23.0))
    ;
    dVar11 = (double)((long)dVar10 & 0xffffffff) * 23.0 + dVar11;
    uVar9 = (ulong)dVar11;
    return (long)(dVar11 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
  }
  return 0xffffffffffffffff;
}

Assistant:

idx_t AlpRDFinalAnalyze(AnalyzeState &state) {
	auto &analyze_state = (AlpRDAnalyzeState<T> &)state;
	if (analyze_state.total_values_count == 0) {
		return DConstants::INVALID_INDEX;
	}
	double factor_of_sampling = 1 / ((double)analyze_state.rowgroup_sample.size() / analyze_state.total_values_count);

	// Finding which is the best dictionary for the sample
	double estimated_bits_per_value =
	    alp::AlpRDCompression<T, true>::FindBestDictionary(analyze_state.rowgroup_sample, analyze_state.state);
	double estimated_compressed_bits = estimated_bits_per_value * analyze_state.rowgroup_sample.size();
	double estimed_compressed_bytes = estimated_compressed_bits / 8;

	//! Overhead per segment: [Pointer to metadata + right bitwidth + left bitwidth + n dict elems] + Dictionary Size
	double per_segment_overhead = AlpRDConstants::HEADER_SIZE + AlpRDConstants::MAX_DICTIONARY_SIZE_BYTES;

	//! Overhead per vector: Pointer to data + Exceptions count
	double per_vector_overhead = AlpRDConstants::METADATA_POINTER_SIZE + AlpRDConstants::EXCEPTIONS_COUNT_SIZE;

	uint32_t n_vectors = LossyNumericCast<uint32_t>(
	    std::ceil((double)analyze_state.total_values_count / AlpRDConstants::ALP_VECTOR_SIZE));

	auto estimated_size = (estimed_compressed_bytes * factor_of_sampling) + (n_vectors * per_vector_overhead);
	uint32_t estimated_n_blocks = LossyNumericCast<uint32_t>(
	    std::ceil(estimated_size / (static_cast<double>(state.info.GetBlockSize()) - per_segment_overhead)));

	auto final_analyze_size = estimated_size + (estimated_n_blocks * per_segment_overhead);
	return LossyNumericCast<idx_t>(final_analyze_size);
}